

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O2

QDate __thiscall QLocale::toDate(QLocale *this,QString *string,FormatType format,int baseYear)

{
  QDate QVar1;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  dateFormat((QString *)&local_40,this,format);
  QVar1 = toDate(this,string,(QString *)&local_40,baseYear);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (QDate)QVar1.jd;
  }
  __stack_chk_fail();
}

Assistant:

QDate QLocale::toDate(const QString &string, FormatType format, int baseYear) const
{
    return toDate(string, dateFormat(format), baseYear);
}